

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Str_Ntk_t * Str_ManNormalize(Gia_Man_t *p)

{
  void *__ptr;
  Gia_Man_t *p_00;
  Vec_Wec_t *vGroups;
  Vec_Int_t *vRoots;
  Str_Ntk_t *pSVar1;
  long lVar2;
  long lVar3;
  
  p_00 = Gia_ManDupMuxes(p,5);
  vGroups = Str_ManDeriveTrees(p_00);
  Str_ManCheckOverlap(p_00,vGroups);
  vRoots = Str_ManCreateRoots(vGroups,p_00->nObjs);
  pSVar1 = Str_ManNormalizeInt(p_00,vGroups,vRoots);
  Gia_ManCleanMark0(p_00);
  Gia_ManStop(p_00);
  if (vRoots->pArray != (int *)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (int *)0x0;
  }
  if (vRoots != (Vec_Int_t *)0x0) {
    free(vRoots);
  }
  if (0 < vGroups->nCap) {
    lVar3 = 8;
    lVar2 = 0;
    do {
      __ptr = *(void **)((long)&vGroups->pArray->nCap + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&vGroups->pArray->nCap + lVar3) = 0;
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar2 < vGroups->nCap);
  }
  if (vGroups->pArray != (Vec_Int_t *)0x0) {
    free(vGroups->pArray);
    vGroups->pArray = (Vec_Int_t *)0x0;
  }
  vGroups->nCap = 0;
  vGroups->nSize = 0;
  free(vGroups);
  return pSVar1;
}

Assistant:

Str_Ntk_t * Str_ManNormalize( Gia_Man_t * p )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pMuxes = Gia_ManDupMuxes( p, 5 );
    Vec_Wec_t * vGroups = Str_ManDeriveTrees( pMuxes );
    Vec_Int_t * vRoots;
    Str_ManCheckOverlap( pMuxes, vGroups );
    vRoots = Str_ManCreateRoots( vGroups, Gia_ManObjNum(pMuxes) );
    pNtk = Str_ManNormalizeInt( pMuxes, vGroups, vRoots );
    Gia_ManCleanMark0( pMuxes );
    Gia_ManStop( pMuxes );
    Vec_IntFree( vRoots );
    Vec_WecFree( vGroups );
    return pNtk;
}